

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::AppendTargetOutputs
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          string *config,cmNinjaTargetDepends depends)

{
  pointer pcVar1;
  pointer pcVar2;
  cmNinjaDeps *this_00;
  bool bVar3;
  TargetType TVar4;
  cmLocalGenerator *this_01;
  string *psVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string output;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  size_type local_98;
  pointer local_90;
  cmNinjaDeps *local_88;
  string local_80;
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  
  bVar3 = cmGeneratorTarget::IsFrameworkOnApple(target);
  TVar4 = cmGeneratorTarget::GetType(target);
  switch(TVar4) {
  case EXECUTABLE:
switchD_003e050c_caseD_0:
    cmGeneratorTarget::GetFullPath(&local_b8,target,config,RuntimeBinaryArtifact,bVar3);
    psVar5 = ConvertToNinjaPath(this,&local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(outputs,psVar5);
    break;
  case STATIC_LIBRARY:
  case SHARED_LIBRARY:
  case MODULE_LIBRARY:
    if (depends != DependOnTargetOrdering) goto switchD_003e050c_caseD_0;
    (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x45])
              (&local_b8,this,target,config);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs,
               &local_b8);
    break;
  case OBJECT_LIBRARY:
    if (depends == DependOnTargetOrdering) {
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x45])
                (&local_b8,this,target,config);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs,
                 &local_b8);
      break;
    }
  case UTILITY:
  case GLOBAL_TARGET:
  case INTERFACE_LIBRARY:
    local_88 = outputs;
    this_01 = cmGeneratorTarget::GetLocalGenerator(target);
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_01);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    pcVar2 = (pointer)psVar5->_M_string_length;
    local_60 = &DAT_00000001;
    local_50 = 0x2f;
    puStack_58 = &local_50;
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    local_b8.field_2._M_allocated_capacity = (size_type)local_60;
    local_b8.field_2._8_8_ = puStack_58;
    local_90 = (psVar5->_M_dataplus)._M_p;
    local_98 = psVar5->_M_string_length;
    views._M_len = 3;
    views._M_array = (iterator)&local_b8;
    local_b8._M_dataplus._M_p = pcVar2;
    local_b8._M_string_length = (size_type)pcVar1;
    cmCatViews_abi_cxx11_(&local_80,views);
    psVar5 = ConvertToNinjaPath(this,&local_80);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar1,pcVar1 + psVar5->_M_string_length);
    bVar3 = cmTarget::IsPerConfig(target->Target);
    this_00 = local_88;
    if (bVar3) {
      (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x48])
                (&local_60,this,&local_b8,config);
      std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_60);
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) {
      return;
    }
    goto LAB_003e06bf;
  default:
    goto switchD_003e050c_default;
  }
  local_80.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
  local_80._M_dataplus._M_p = local_b8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_003e06bf:
    operator_delete(local_80._M_dataplus._M_p,(ulong)(local_80.field_2._M_allocated_capacity + 1));
  }
switchD_003e050c_default:
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetOutputs(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  const std::string& config, cmNinjaTargetDepends depends) const
{
  // for frameworks, we want the real name, not smple name
  // frameworks always appear versioned, and the build.ninja
  // will always attempt to manage symbolic links instead
  // of letting cmOSXBundleGenerator do it.
  bool realname = target->IsFrameworkOnApple();

  switch (target->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(this->OrderDependsTargetForTarget(target, config));
        break;
      }
    }
      CM_FALLTHROUGH;
    case cmStateEnums::EXECUTABLE: {
      outputs.push_back(this->ConvertToNinjaPath(target->GetFullPath(
        config, cmStateEnums::RuntimeBinaryArtifact, realname)));
      break;
    }
    case cmStateEnums::OBJECT_LIBRARY: {
      if (depends == DependOnTargetOrdering) {
        outputs.push_back(this->OrderDependsTargetForTarget(target, config));
        break;
      }
    }
      CM_FALLTHROUGH;
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::UTILITY: {
      std::string path =
        cmStrCat(target->GetLocalGenerator()->GetCurrentBinaryDirectory(), '/',
                 target->GetName());
      std::string output = this->ConvertToNinjaPath(path);
      if (target->Target->IsPerConfig()) {
        output = this->BuildAlias(output, config);
      }
      outputs.push_back(output);
      break;
    }

    case cmStateEnums::UNKNOWN_LIBRARY:
      break;
  }
}